

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O1

void QWizard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QFlagsStorage<QWizard::WizardOption> *pQVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  QWizardPrivate *this;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    ppvVar3 = &local_38;
    local_38 = (void *)0x0;
    iVar5 = 0;
    goto LAB_00519636;
  case 1:
    iVar5 = 1;
    ppvVar3 = (void **)0x0;
    goto LAB_00519636;
  case 2:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    ppvVar3 = &local_38;
    local_38 = (void *)0x0;
    iVar5 = 2;
    goto LAB_00519636;
  case 3:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    ppvVar3 = &local_38;
    local_38 = (void *)0x0;
    iVar5 = 3;
    goto LAB_00519636;
  case 4:
    local_3c = *_a[1];
    puStack_30 = &local_3c;
    ppvVar3 = &local_38;
    local_38 = (void *)0x0;
    iVar5 = 4;
LAB_00519636:
    QMetaObject::activate(_o,&staticMetaObject,iVar5,ppvVar3);
    break;
  case 5:
    back((QWizard *)_o);
    break;
  case 6:
    next((QWizard *)_o);
    break;
  case 7:
    setCurrentId((QWizard *)_o,*_a[1]);
    break;
  case 8:
    restart((QWizard *)_o);
    break;
  case 9:
    QWizardPrivate::_q_emitCustomButtonClicked(*(QWizardPrivate **)(_o + 8));
    break;
  case 10:
    QWizardPrivate::_q_updateButtonStates(*(QWizardPrivate **)(_o + 8));
    break;
  case 0xb:
    QWizardPrivate::_q_handleFieldObjectDestroyed(*(QWizardPrivate **)(_o + 8),*_a[1]);
  }
  if (_c == ReadProperty) {
switchD_005194f0_caseD_1:
    if ((uint)_id < 6) {
      switch(_id) {
      case 0:
        lVar4 = 900;
        break;
      case 1:
        lVar4 = 0x388;
        break;
      case 2:
        lVar4 = 0x3b8;
        break;
      case 3:
        lVar4 = 0x3bc;
        break;
      case 4:
        lVar4 = 0x338;
        break;
      case 5:
        lVar4 = 0x340;
      }
      *(undefined4 *)*_a = *(undefined4 *)(lVar4 + *(long *)(_o + 8));
    }
    if (_c != WriteProperty) goto switchD_005194f0_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_005194f0_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == currentIdChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_005194f0_caseD_3;
    }
    if (((code *)*plVar1 == helpRequested) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_005194f0_caseD_3;
    }
    if (((code *)*plVar1 == customButtonClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_005194f0_caseD_3;
    }
    if (((code *)*plVar1 == pageAdded) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_005194f0_caseD_3;
    }
    if (((code *)*plVar1 == pageRemoved) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 4;
      goto switchD_005194f0_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_005194f0_caseD_3;
      goto switchD_005194f0_caseD_1;
    }
  }
  if (5 < (uint)_id) goto switchD_005194f0_caseD_3;
  pQVar2 = (QFlagsStorage<QWizard::WizardOption> *)*_a;
  switch(_id) {
  case 0:
    setWizardStyle((QWizard *)_o,pQVar2->i);
    break;
  case 1:
    setOptions((QWizard *)_o,(WizardOptions)pQVar2->i);
    break;
  case 2:
    this = *(QWizardPrivate **)(_o + 8);
    this->titleFmt = pQVar2->i;
    goto LAB_005197e5;
  case 3:
    this = *(QWizardPrivate **)(_o + 8);
    this->subTitleFmt = pQVar2->i;
LAB_005197e5:
    QWizardPrivate::updateLayout(this);
    break;
  case 4:
    setStartId((QWizard *)_o,pQVar2->i);
    break;
  case 5:
    setCurrentId((QWizard *)_o,pQVar2->i);
  }
switchD_005194f0_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIdChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->helpRequested(); break;
        case 2: _t->customButtonClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->pageAdded((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->pageRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->back(); break;
        case 6: _t->next(); break;
        case 7: _t->setCurrentId((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->restart(); break;
        case 9: _t->d_func()->_q_emitCustomButtonClicked(); break;
        case 10: _t->d_func()->_q_updateButtonStates(); break;
        case 11: _t->d_func()->_q_handleFieldObjectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::currentIdChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)()>(_a, &QWizard::helpRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::customButtonClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageAdded, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageRemoved, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<WizardStyle*>(_v) = _t->wizardStyle(); break;
        case 1: QtMocHelpers::assignFlags<WizardOptions>(_v, _t->options()); break;
        case 2: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->titleFormat(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->subTitleFormat(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->startId(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->currentId(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWizardStyle(*reinterpret_cast<WizardStyle*>(_v)); break;
        case 1: _t->setOptions(*reinterpret_cast<WizardOptions*>(_v)); break;
        case 2: _t->setTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 3: _t->setSubTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStartId(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCurrentId(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}